

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QAccessibleInterface*,unsigned_int>::emplace<unsigned_int_const&>
          (QHash<QAccessibleInterface*,unsigned_int> *this,QAccessibleInterface **key,uint *args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<QAccessibleInterface_*,_unsigned_int>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<QAccessibleInterface_*,_unsigned_int> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 != (Data *)0x0) {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<unsigned_int_const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_28.d._0_4_ = *args;
        pVar3 = (piter)QHash<QAccessibleInterface_*,_unsigned_int>::emplace_helper<unsigned_int>
                                 ((QHash<QAccessibleInterface_*,_unsigned_int> *)this,key,
                                  (uint *)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_00597d3c;
    }
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  pDVar2 = *(Data<QHashPrivate::Node<QAccessibleInterface_*,_unsigned_int>_> **)this;
  local_28.d = pDVar1;
  if ((pDVar2 == (Data<QHashPrivate::Node<QAccessibleInterface_*,_unsigned_int>_> *)0x0) ||
     (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QAccessibleInterface_*,_unsigned_int>_>::detached
                       (pDVar2);
    *(Data<QHashPrivate::Node<QAccessibleInterface_*,_unsigned_int>_> **)this = pDVar2;
  }
  pVar3 = (piter)emplace_helper<unsigned_int_const&>(this,key,args);
  QHash<QAccessibleInterface_*,_unsigned_int>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_00597d3c:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }